

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.cpp
# Opt level: O3

ec_point __thiscall jbcoin::openssl::multiply(openssl *this,EC_GROUP *group,bignum *n,bn_ctx *ctx)

{
  int iVar1;
  EC_POINT *r;
  
  r = EC_POINT_new((EC_GROUP *)group);
  *(EC_POINT **)this = r;
  if (r == (EC_POINT *)0x0) {
    Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"EC_POINT_new() failed");
  }
  iVar1 = EC_POINT_mul((EC_GROUP *)group,r,(BIGNUM *)n->ptr,(EC_POINT *)0x0,(BIGNUM *)0x0,
                       (BN_CTX *)ctx->ptr);
  if (iVar1 != 0) {
    return (ec_point)(pointer_t)this;
  }
  Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"EC_POINT_mul() failed");
}

Assistant:

ec_point multiply (EC_GROUP const* group,
                   bignum const& n,
                   bn_ctx& ctx)
{
    ec_point result (group);
    if (! EC_POINT_mul (group, result.get(), n.get(), nullptr, nullptr, ctx.get()))
        Throw<std::runtime_error> ("EC_POINT_mul() failed");

    return result;
}